

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

bool __thiscall
HEkk::proofOfPrimalInfeasibility(HEkk *this,HVector *row_ep,HighsInt move_out,HighsInt row_out)

{
  vector<double,_std::allocator<double>_> *result_value;
  vector<int,_std::allocator<int>_> *result_index;
  double *pdVar1;
  int iVar2;
  bool bVar3;
  pointer piVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  pointer pdVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  HighsSparseMatrix *this_00;
  long lVar12;
  int iVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_128;
  double local_118;
  double local_108;
  double local_f0;
  double local_e8;
  double local_d8;
  double local_b0;
  double local_a8;
  string local_a0;
  vector<int,_std::allocator<int>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  string local_50;
  
  bVar3 = this->debug_iteration_report_;
  bVar6 = (this->status_).has_ar_matrix;
  if (row_ep->count < 1) {
    local_f0 = 0.0;
    local_d8 = 0.0;
  }
  else {
    lVar12 = 0;
    iVar13 = 0;
    local_e8 = 0.0;
    iVar14 = 0;
    local_a8 = 0.0;
    iVar2 = 0;
    local_b0 = 0.0;
    local_d8 = 0.0;
    local_f0 = 0.0;
    do {
      uVar9 = (row_ep->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12];
      dVar18 = (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar9];
      dVar15 = getMaxAbsRowValue(this,uVar9);
      if (ABS(dVar15 * dVar18) <= (this->options_->super_HighsOptionsStruct).small_matrix_value) {
        if (((bVar3 != false) && (iVar13 < 0x19)) && (local_e8 < ABS(dVar18))) {
          printf("Zeroed row_ep.array[%6d] = %11.4g due to being small in contribution\n",
                 (ulong)uVar9);
          iVar13 = iVar13 + 1;
          local_e8 = ABS(dVar18);
        }
LAB_00348fa7:
        (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(int)uVar9] = 0.0;
      }
      else {
        pdVar8 = (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar15 = pdVar8[(int)uVar9] * (double)move_out;
        pdVar8[(int)uVar9] = dVar15;
        if (dVar15 <= 0.0) {
          local_108 = (this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[(int)uVar9];
          bVar5 = highs_isInfinity(local_108);
          if (bVar5) {
            if (((bVar3 != false) && (iVar2 < 0x19)) && (local_b0 < ABS(dVar18))) {
              printf("Zeroed row_ep.array[%6d] = %11.4g due to infinite upper bound\n",(ulong)uVar9)
              ;
              iVar2 = iVar2 + 1;
              local_b0 = ABS(dVar18);
            }
            goto LAB_00348fa7;
          }
        }
        else {
          local_108 = (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[(int)uVar9];
          bVar5 = highs_isInfinity(-local_108);
          if (bVar5) {
            if (((bVar3 != false) && (iVar14 < 0x19)) && (local_a8 < ABS(dVar18))) {
              printf("Zeroed row_ep.array[%6d] = %11.4g due to infinite lower bound\n",(ulong)uVar9)
              ;
              iVar14 = iVar14 + 1;
              local_a8 = ABS(dVar18);
            }
            goto LAB_00348fa7;
          }
        }
        local_108 = local_108 *
                    (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar9];
        dVar18 = local_f0 + local_108;
        local_d8 = local_d8 +
                   (local_f0 - (dVar18 - local_108)) + (local_108 - (dVar18 - (dVar18 - local_108)))
        ;
        local_f0 = dVar18;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < row_ep->count);
  }
  pdVar8 = (this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar8) {
    (this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar8;
  }
  result_value = &this->proof_value_;
  result_index = &this->proof_index_;
  piVar4 = (this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    (this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4;
  }
  this_00 = &(this->lp_).a_matrix_;
  if (bVar6 != false) {
    this_00 = &this->ar_matrix_;
  }
  HighsSparseMatrix::productTransposeQuad(this_00,result_value,result_index,row_ep,-2);
  uVar10 = (ulong)((long)(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  uVar9 = (uint)uVar10;
  if (bVar3 != false) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Row e_p","");
    HSimplexNla::reportArray(&this->simplex_nla_,&local_a0,(this->lp_).num_col_,row_ep,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Proof","");
    std::vector<double,_std::allocator<double>_>::vector(&local_68,result_value);
    std::vector<int,_std::allocator<int>_>::vector(&local_80,result_index);
    HSimplexNla::reportVector(&this->simplex_nla_,&local_50,uVar9,&local_68,&local_80,true);
    if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_128 = 0.0;
    printf("HEkk::proofOfPrimalInfeasibility row_ep.count = %d; proof_num_nz = %d; row_ep_scale = %g\n"
           ,(ulong)(uint)row_ep->count,uVar10 & 0xffffffff);
    if (0 < (int)uVar9) {
      uVar10 = 0;
      iVar14 = 0;
      do {
        if (((this->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start
             [(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10]] == '\0') &&
           (dVar18 = ABS((this->proof_value_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar10]),
           iVar14 < 0x19 && local_128 < dVar18)) {
          printf("Proof entry %6d (Column %6d) is basic with value %11.4g\n",uVar10 & 0xffffffff);
          iVar14 = iVar14 + 1;
          local_128 = dVar18;
        }
        uVar10 = uVar10 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar10);
    }
  }
  if ((int)uVar9 < 1) {
    dVar19 = 0.0;
    dVar18 = 0.0;
    dVar15 = 0.0;
  }
  else {
    uVar10 = 0;
    local_118 = 0.0;
    dVar15 = 0.0;
    dVar19 = 0.0;
    dVar16 = 0.0;
    do {
      iVar14 = (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar10];
      dVar17 = (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar10];
      dVar18 = dVar16;
      if (dVar17 <= 0.0) {
        bVar6 = highs_isInfinity(-(this->lp_).col_lower_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar14]);
        if (!bVar6) {
          pdVar8 = (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          goto LAB_00349416;
        }
        dVar16 = local_118 - dVar17;
        dVar15 = dVar15 + (local_118 - (dVar17 + dVar16)) + (-dVar17 - (dVar16 - (dVar17 + dVar16)))
        ;
        pdVar1 = &(this->options_->super_HighsOptionsStruct).small_matrix_value;
        cVar7 = (dVar16 + dVar15 < *pdVar1 || dVar16 + dVar15 == *pdVar1) * '\x02' + '\b';
        local_118 = dVar16;
      }
      else {
        bVar6 = highs_isInfinity((this->lp_).col_upper_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar14]);
        if (bVar6) {
          dVar16 = local_118 + dVar17;
          dVar15 = dVar15 + ((dVar16 - dVar17) - dVar16) + dVar17 + (local_118 - (dVar16 - dVar17));
          pdVar1 = &(this->options_->super_HighsOptionsStruct).small_matrix_value;
          cVar7 = (dVar16 + dVar15 < *pdVar1 || dVar16 + dVar15 == *pdVar1) * '\x02' + '\b';
          local_118 = dVar16;
        }
        else {
          pdVar8 = (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
LAB_00349416:
          dVar17 = dVar17 * pdVar8[iVar14];
          dVar18 = dVar16 + dVar17;
          dVar19 = dVar19 + (dVar16 - (dVar18 - dVar17)) + (dVar17 - (dVar18 - (dVar18 - dVar17)));
          cVar7 = '\0';
        }
      }
    } while (((cVar7 == '\n') || (cVar7 == '\0')) &&
            (uVar10 = uVar10 + 1, dVar16 = dVar18, (uVar9 & 0x7fffffff) != uVar10));
    dVar15 = dVar15 + local_118;
  }
  dVar16 = (this->options_->super_HighsOptionsStruct).small_matrix_value;
  dVar17 = local_f0 - dVar18;
  dVar17 = ((local_d8 +
            (-dVar18 - (dVar17 - local_f0)) + (local_f0 - (dVar17 - (dVar17 - local_f0)))) - dVar19)
           + dVar17;
  bVar6 = (this->options_->super_HighsOptionsStruct).primal_feasibility_tolerance < dVar17;
  if (bVar3 != false) {
    pcVar11 = "in";
    if (dVar15 <= dVar16) {
      pcVar11 = "";
    }
    printf("HEkk::proofOfPrimalInfeasibility has %sfinite implied upper bound",pcVar11);
    if (dVar15 <= dVar16) {
      printf(" and gap = %g",dVar17);
    }
    pcVar11 = "false";
    if (dVar15 <= dVar16 && bVar6) {
      pcVar11 = "true";
    }
    printf(" so proof is %s\n",pcVar11);
  }
  return dVar15 <= dVar16 && bVar6;
}

Assistant:

bool HEkk::proofOfPrimalInfeasibility(HVector& row_ep, const HighsInt move_out,
                                      const HighsInt row_out) {
  // To be called from inside HEkkDual
  HighsLp& lp = this->lp_;

  HighsInt debug_product_report = kDebugReportOff;
  const bool debug_proof_report_on = true;
  bool debug_rows_report = false;
  bool debug_proof_report = false;
  if (debug_iteration_report_) {
    if (debug_proof_report_on)
      debug_product_report = kDebugReportOff;  // kDebugReportAll; //
    debug_rows_report = debug_proof_report_on;
    debug_proof_report = debug_proof_report_on;
  }

  const bool use_row_wise_matrix = status_.has_ar_matrix;
  const bool use_iterative_refinement = false;  // debug_iteration_report_;//
  if (use_iterative_refinement) {
    simplex_nla_.reportArray("Row e_p.0", lp.num_col_, &row_ep, true);
    unitBtranIterativeRefinement(row_out, row_ep);
    simplex_nla_.reportArray("Row e_p.1", lp.num_col_, &row_ep, true);
  }

  // Refine row_ep by removing relatively small values
  double row_ep_scale = 0;
  // if (use_refinement) refineArray(row_ep, row_ep_scale,
  // refinement_tolerance);
  // Determine the maximum absolute value in row_ep
  HighsCDouble proof_lower = 0.0;
  const HighsInt max_num_basic_proof_report = 25;
  const HighsInt max_num_zeroed_report = 25;
  HighsInt num_zeroed_for_small_report = 0;
  double max_zeroed_for_small_value = 0;
  HighsInt num_zeroed_for_lb_report = 0;
  double max_zeroed_for_lb_value = 0;
  HighsInt num_zeroed_for_ub_report = 0;
  double max_zeroed_for_ub_value = 0;
  for (HighsInt iX = 0; iX < row_ep.count; iX++) {
    HighsInt iRow = row_ep.index[iX];
    // Give row_ep the sign of the leaving row - as is done in
    // getDualRayInterface.
    const double row_ep_value = row_ep.array[iRow];
    assert(row_ep_value);
    if (std::abs(row_ep_value * getMaxAbsRowValue(iRow)) <=
        options_->small_matrix_value) {
      if (debug_proof_report) {
        const double abs_row_ep_value = std::abs(row_ep_value);
        if (num_zeroed_for_small_report < max_num_zeroed_report &&
            max_zeroed_for_small_value < abs_row_ep_value) {
          printf(
              "Zeroed row_ep.array[%6d] = %11.4g due to being small in "
              "contribution\n",
              (int)iRow, row_ep_value);
          num_zeroed_for_small_report++;
          max_zeroed_for_small_value = abs_row_ep_value;
        }
      }
      row_ep.array[iRow] = 0.0;
      continue;
    }

    row_ep.array[iRow] *= move_out;

    // make sure infinite sides are not used
    double rowBound;
    if (row_ep.array[iRow] > 0) {
      rowBound = lp.row_lower_[iRow];
      if (highs_isInfinity(-rowBound)) {
        // row lower bound is infinite
        if (debug_proof_report) {
          const double abs_row_ep_value = std::abs(row_ep_value);
          if (num_zeroed_for_lb_report < max_num_zeroed_report &&
              max_zeroed_for_lb_value < abs_row_ep_value) {
            printf(
                "Zeroed row_ep.array[%6d] = %11.4g due to infinite lower "
                "bound\n",
                (int)iRow, row_ep_value);
            num_zeroed_for_lb_report++;
            max_zeroed_for_lb_value = abs_row_ep_value;
          }
        }
        row_ep.array[iRow] = 0.0;
        continue;
      }

    } else {
      rowBound = lp.row_upper_[iRow];
      if (highs_isInfinity(rowBound)) {
        // row upper bound is infinite
        if (debug_proof_report) {
          const double abs_row_ep_value = std::abs(row_ep_value);
          if (num_zeroed_for_ub_report < max_num_zeroed_report &&
              max_zeroed_for_ub_value < abs_row_ep_value) {
            printf(
                "Zeroed row_ep.array[%6d] = %11.4g due to infinite upper "
                "bound\n",
                (int)iRow, row_ep_value);
            num_zeroed_for_ub_report++;
            max_zeroed_for_ub_value = abs_row_ep_value;
          }
        }
        row_ep.array[iRow] = 0.0;
        continue;
      }
    }
    // add up lower bound of proof constraint
    proof_lower += row_ep.array[iRow] * rowBound;
  }
  // Form the proof constraint coefficients
  proof_value_.clear();
  proof_index_.clear();
  vector<double>& proof_value = this->proof_value_;
  vector<HighsInt>& proof_index = this->proof_index_;
  if (use_row_wise_matrix) {
    this->ar_matrix_.productTransposeQuad(proof_value, proof_index, row_ep,
                                          debug_product_report);
  } else {
    lp.a_matrix_.productTransposeQuad(proof_value, proof_index, row_ep,
                                      debug_product_report);
  }

  HighsInt proof_num_nz = proof_index.size();
  if (debug_rows_report) {
    simplex_nla_.reportArray("Row e_p", lp.num_col_, &row_ep, true);
    simplex_nla_.reportVector("Proof", proof_num_nz, proof_value, proof_index,
                              true);
  }
  if (debug_proof_report) {
    printf(
        "HEkk::proofOfPrimalInfeasibility row_ep.count = %d; proof_num_nz = "
        "%d; row_ep_scale = %g\n",
        (int)row_ep.count, (int)proof_num_nz, row_ep_scale);
    HighsInt num_basic_proof_report = 0;
    double max_basic_proof_value = 0;
    for (HighsInt i = 0; i < proof_num_nz; ++i) {
      const HighsInt iCol = proof_index[i];
      const double value = proof_value[i];
      const double abs_value = std::abs(value);
      if (!basis_.nonbasicFlag_[iCol] && max_basic_proof_value < abs_value &&
          num_basic_proof_report < max_num_basic_proof_report) {
        printf("Proof entry %6d (Column %6d) is basic with value %11.4g\n",
               (int)i, (int)iCol, value);
        max_basic_proof_value = abs_value;
        num_basic_proof_report++;
      }
    }
  }
  HighsCDouble implied_upper = 0.0;
  HighsCDouble sumInf = 0.0;
  for (HighsInt i = 0; i < proof_num_nz; ++i) {
    const HighsInt iCol = proof_index[i];
    const double value = proof_value[i];
    if (value > 0) {
      if (highs_isInfinity(lp.col_upper_[iCol])) {
        sumInf += value;
        if (sumInf > options_->small_matrix_value) break;
        continue;
        // Commented out unreachable code
        //        if (value <= options_->small_matrix_value) continue;
      }
      implied_upper += value * lp.col_upper_[iCol];
    } else {
      if (highs_isInfinity(-lp.col_lower_[iCol])) {
        sumInf += -value;
        if (sumInf > options_->small_matrix_value) break;
        continue;
      }
      implied_upper += value * lp.col_lower_[iCol];
    }
  }
  bool infinite_implied_upper = sumInf > options_->small_matrix_value;
  const double gap = double(proof_lower - implied_upper);
  const bool gap_ok = gap > options_->primal_feasibility_tolerance;
  const bool proof_of_primal_infeasibility = !infinite_implied_upper && gap_ok;

  const double local_report = false;
  if (!proof_of_primal_infeasibility && local_report) {
    printf(
        "HEkk::proofOfPrimalInfeasibility: row %6d; gap = %11.4g (%s); "
        "sumInf = %11.4g (%s) so proof is %s\n",
        (int)row_out, gap, highsBoolToString(gap_ok).c_str(), (double)sumInf,
        highsBoolToString(infinite_implied_upper).c_str(),
        highsBoolToString(proof_of_primal_infeasibility).c_str());
  }
  if (debug_proof_report) {
    printf("HEkk::proofOfPrimalInfeasibility has %sfinite implied upper bound",
           infinite_implied_upper ? "in" : "");
    if (!infinite_implied_upper) printf(" and gap = %g", gap);
    printf(" so proof is %s\n",
           proof_of_primal_infeasibility ? "true" : "false");
  }
  return proof_of_primal_infeasibility;
}